

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_Widget_Type::make(Fl_Widget_Type *this)

{
  Fl_Type **ppFVar1;
  uint uVar2;
  char *n;
  int iVar3;
  int iVar4;
  Fl_Widget_Type *this_00;
  undefined4 extraout_var_00;
  Fl_Widget *this_01;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Fl_Type *pFVar10;
  int iVar11;
  uint uVar12;
  Fl_Type *pFVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  pFVar13 = Fl_Type::current;
  if (Fl_Type::current != (Fl_Type *)0x0) {
    do {
      iVar3 = (*pFVar13->_vptr_Fl_Type[0x17])(pFVar13);
      if ((iVar3 != 0) && (iVar3 = (*pFVar13->_vptr_Fl_Type[0x1e])(pFVar13), iVar3 == 0)) {
        pFVar10 = pFVar13;
        if (((force_parent != 0) || (iVar3 = (*pFVar13->_vptr_Fl_Type[0x20])(pFVar13), iVar3 == 0))
           && (iVar3 = (*pFVar13->parent->_vptr_Fl_Type[0x17])(), iVar3 != 0)) {
          pFVar10 = pFVar13->parent;
        }
        force_parent = 0;
        uVar7 = *(int *)&(pFVar10[1].prev)->user_data_type_ / 2;
        uVar5 = *(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4) / 2;
        if ((int)uVar7 <= (int)uVar5) {
          uVar5 = uVar7;
        }
        uVar7 = 0x19;
        if ((int)uVar5 < 0x19) {
          uVar7 = uVar5;
        }
        iVar4 = (*pFVar10->_vptr_Fl_Type[0x21])(pFVar10);
        iVar3 = 0;
        iVar11 = 0;
        if (iVar4 == 0) {
          iVar3 = *(int *)&(pFVar10[1].prev)->user_data_;
          iVar11 = *(int *)((long)&(pFVar10[1].prev)->user_data_ + 4);
        }
        iVar4 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x20])(this);
        if (iVar4 == 0) {
          if (pFVar13 == pFVar10) {
            uVar6 = iVar3 + uVar7;
            uVar5 = uVar7;
            uVar12 = iVar11 + uVar7;
            uVar9 = uVar7;
          }
          else {
            pFVar13 = pFVar13[1].prev;
            uVar5 = *(uint *)&pFVar13->user_data_type_;
            uVar9 = *(uint *)((long)&pFVar13->user_data_type_ + 4);
            uVar2 = *(uint *)&pFVar13->user_data_;
            uVar12 = *(uint *)((long)&pFVar13->user_data_ + 4);
            uVar6 = uVar2 + uVar5;
            if (iVar3 + *(int *)&(pFVar10[1].prev)->user_data_type_ < (int)(uVar2 + uVar5 + uVar5))
            {
              uVar8 = uVar12 + uVar9;
              uVar6 = uVar2;
              uVar12 = uVar7 + iVar11;
              if ((int)(uVar8 + uVar9) <=
                  *(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4) + iVar11) {
                uVar12 = uVar8;
              }
            }
          }
        }
        else {
          uVar6 = iVar3 + uVar7;
          uVar5 = *(int *)&(pFVar10[1].prev)->user_data_type_ - uVar7;
          uVar12 = iVar11 + uVar7;
          uVar9 = *(int *)((long)&(pFVar10[1].prev)->user_data_type_ + 4) - uVar7;
        }
        if (1 < gridx) {
          uVar6 = uVar6 - (int)uVar6 % gridx;
          uVar5 = ((int)(uVar5 - 1) / gridx + 1) * gridx;
        }
        if (1 < gridy) {
          uVar12 = uVar12 - (int)uVar12 % gridy;
          uVar9 = ((int)(uVar9 - 1) / gridy + 1) * gridy;
        }
        iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2a])(this);
        this_00 = (Fl_Widget_Type *)CONCAT44(extraout_var,iVar3);
        if (this->o == (Fl_Widget *)0x0) {
          iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])(this,0,0,100,100);
          this->o = (Fl_Widget *)CONCAT44(extraout_var_00,iVar3);
        }
        (this_00->super_Fl_Type).factory = &this->super_Fl_Type;
        iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                          (this,(ulong)uVar6,(ulong)uVar12,(ulong)uVar5,(ulong)uVar9);
        this_01 = (Fl_Widget *)CONCAT44(extraout_var_01,iVar3);
        this_00->o = this_01;
        if (reading_file == 0) {
          n = (this_01->label_).value;
          if (n != (char *)0x0) {
            Fl_Type::label((Fl_Type *)this_00,n);
          }
        }
        else {
          Fl_Widget::label(this_01,(char *)0x0);
        }
        this_00->o->user_data_ = this_00;
        Fl_Type::add((Fl_Type *)this_00,pFVar10);
        redraw(this_00);
        return &this_00->super_Fl_Type;
      }
      ppFVar1 = &pFVar13->parent;
      pFVar13 = *ppFVar1;
    } while (*ppFVar1 != (Fl_Type *)0x0);
  }
  fl_message("Please select a widget");
  return (Fl_Type *)0x0;
}

Assistant:

Fl_Type *Fl_Widget_Type::make() {
  // Find the current widget, or widget to copy:
  Fl_Type *qq = Fl_Type::current;
  while (qq && (!qq->is_widget() || qq->is_menu_item())) qq = qq->parent;
  if (!qq) {
    fl_message("Please select a widget");
    return 0;
  }
  Fl_Widget_Type* q = (Fl_Widget_Type*)qq;
  // find the parent widget:
  Fl_Widget_Type* p = q;
  if ((force_parent || !p->is_group()) && p->parent->is_widget())
    p = (Fl_Widget_Type*)(p->parent);
  force_parent = 0;

  // Figure out a border between widget and window:
  int B = p->o->w()/2; if (p->o->h()/2 < B) B = p->o->h()/2; if (B>25) B = 25;

  int ULX,ULY; // parent's origin in window
  if (!p->is_window()) { // if it is a group, add corner
    ULX = p->o->x(); ULY = p->o->y();
  } else {
    ULX = ULY = 0;
  }

  // Figure out a position and size for the widget
  int X,Y,W,H;
  if (is_group()) {	// fill the parent with the widget
    X = ULX+B;
    W = p->o->w()-B;
    Y = ULY+B;
    H = p->o->h()-B;
  } else if (q != p) {	// copy position and size of current widget
    W = q->o->w();
    H = q->o->h();
    X = q->o->x()+W;
    Y = q->o->y();
    if (X+W > ULX+p->o->w()) {
      X = q->o->x();
      Y = q->o->y()+H;
      if (Y+H > ULY+p->o->h()) Y = ULY+B;
    }
  } else {	// just make it small and square...
    X = ULX+B;
    Y = ULY+B;
    W = H = B;
  }

  // satisfy the grid requirements (otherwise it edits really strangely):
  if (gridx>1) {
    X = (X/gridx)*gridx;
    W = ((W-1)/gridx+1)*gridx;
  }
  if (gridy>1) {
    Y = (Y/gridy)*gridy;
    H = ((H-1)/gridy+1)*gridy;
  }

  // Construct the Fl_Type:
  Fl_Widget_Type *t = _make();
  if (!o) o = widget(0,0,100,100); // create template widget
  t->factory = this;
  // Construct the Fl_Widget:
  t->o = widget(X,Y,W,H);
  if (reading_file) t->o->label(0);
  else if (t->o->label()) t->label(t->o->label()); // allow editing
  t->o->user_data((void*)t);
  // Put it in the parent:
  //  ((Fl_Group *)(p->o))->add(t->o); (done by Fl_Type::add())
  // add to browser:
  t->add(p);
  t->redraw();
  return t;
}